

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<32U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<32U,_unsigned_int,_void,_true>::operator/=
          (uintwide_t<32U,_unsigned_int,_void,_true> *this,
          uintwide_t<32U,_unsigned_int,_void,_true> *other)

{
  value_type_conflict avVar1 [1];
  value_type_conflict avVar2 [1];
  array<unsigned_int,_1UL> aVar3;
  iterator it;
  local_unsigned_wide_type b;
  array<unsigned_int,_1UL> local_28;
  array<unsigned_int,_1UL> local_24;
  
  if (this == other) {
    (this->values).super_array<unsigned_int,_1UL>.elems[0] = 1;
  }
  else {
    avVar1[0] = (other->values).super_array<unsigned_int,_1UL>.elems[0];
    if (avVar1[0] == 0) {
      (this->values).super_array<unsigned_int,_1UL>.elems[0] = 0x7fffffff;
    }
    else {
      avVar2[0] = (this->values).super_array<unsigned_int,_1UL>.elems[0];
      if ((int)(avVar2[0] | avVar1[0]) < 0) {
        local_24.elems[0] = (value_type_conflict  [1])(value_type_conflict  [1])avVar2[0];
        if ((int)avVar2[0] < 0) {
          local_24.elems[0] = (value_type_conflict  [1])-avVar2[0];
        }
        local_28.elems[0] = (value_type_conflict  [1])(value_type_conflict  [1])avVar1[0];
        if ((int)avVar1[0] < 0) {
          local_28.elems[0] = (value_type_conflict  [1])-avVar1[0];
        }
        uintwide_t<32U,_unsigned_int,_void,_false>::eval_divide_knuth
                  ((uintwide_t<32U,_unsigned_int,_void,_false> *)&local_24,
                   (uintwide_t<32U,_unsigned_int,_void,_false> *)&local_28,
                   (uintwide_t<32U,_unsigned_int,_void,_false> *)0x0);
        aVar3.elems[0] = (value_type_conflict  [1])(value_type_conflict  [1])-(int)local_24.elems[0]
        ;
        if ((int)avVar2[0] < 0 == (int)avVar1[0] < 0) {
          aVar3.elems[0] = local_24.elems[0];
        }
        (this->values).super_array<unsigned_int,_1UL>.elems[0] = (value_type_conflict)aVar3.elems[0]
        ;
      }
      else {
        eval_divide_knuth(this,other,(uintwide_t<32U,_unsigned_int,_void,_true> *)0x0);
      }
    }
  }
  return this;
}

Assistant:

constexpr auto operator/=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        values.front() = static_cast<limb_type>(UINT8_C(1));

        detail::fill_unsafe(detail::advance_and_point(values.begin(), 1U), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else if(other.is_zero())
      {
        static_cast<void>(operator=(limits_helper_max<IsSigned>()));
      }
      else
      {
        // Unary division function.

        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          a.eval_divide_knuth(b);

          if(numer_was_neg != denom_was_neg) { a.negate(); }

          values = a.values;
        }
        else
        {
          eval_divide_knuth(other);
        }
      }

      return *this;
    }